

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrintVisitor.cpp
# Opt level: O0

void __thiscall IRT::PrintVisitor::Visit(PrintVisitor *this,CTempExpression *expression)

{
  allocator local_89;
  string local_88 [48];
  CTemp local_58;
  undefined1 local_38 [40];
  CTempExpression *expression_local;
  PrintVisitor *this_local;
  
  this->lastVisited = this->lastVisited + 1;
  local_38._32_8_ = expression;
  expression_local = (CTempExpression *)this;
  CTempExpression::getTemprorary(expression);
  CTemp::ToString_abi_cxx11_(&local_58);
  ConstructLabel((PrintVisitor *)local_38,(string *)this,(int)&local_58);
  std::__cxx11::string::operator=((string *)&this->description,(string *)local_38);
  std::__cxx11::string::~string((string *)local_38);
  std::__cxx11::string::~string((string *)&local_58);
  AddArrow(this,this->lastVisited);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_88,"Temp",&local_89);
  AddLabel(this,(string *)local_88);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  this->lastVisited = this->lastVisited + 1;
  return;
}

Assistant:

void IRT::PrintVisitor::Visit( const IRT::CTempExpression &expression ) {
    ++lastVisited;
    description = ConstructLabel( expression.getTemprorary( ).ToString( ), lastVisited );
    AddArrow( lastVisited );
    AddLabel( "Temp" );
    ++lastVisited;
}